

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductHolder<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ValueArray<aom_rc_mode,_aom_rc_mode,_aom_rc_mode,_aom_rc_mode>_>
::~CartesianProductHolder
          (CartesianProductHolder<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ValueArray<aom_rc_mode,_aom_rc_mode,_aom_rc_mode,_aom_rc_mode>_>
           *this)

{
  std::
  tuple<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ValueArray<aom_rc_mode,_aom_rc_mode,_aom_rc_mode,_aom_rc_mode>_>
  ::~tuple((tuple<testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ValueArray<aom_rc_mode,_aom_rc_mode,_aom_rc_mode,_aom_rc_mode>_>
            *)0x663dde);
  return;
}

Assistant:

CartesianProductHolder(const Gen&... g) : generators_(g...) {}